

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O1

int main(void)

{
  addrinfo *paVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  addrinfo local_218;
  char local_1e8 [8];
  char s [46];
  undefined1 local_1b0 [8];
  sockaddr_storage their_addr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  msgs;
  vector<cUser,_std::allocator<cUser>_> currUsers;
  reference_wrapper<bool[10]> local_f8;
  reference_wrapper<bool[10]> local_f0;
  reference_wrapper<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  reference_wrapper<std::vector<cUser,_std::allocator<cUser>_>_> local_e0;
  _Deque_base<int,_std::allocator<int>_> local_d8;
  addrinfo *local_88;
  addrinfo *servinfo;
  bool msgFlags [10];
  socklen_t sin_size;
  int yes;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  bool finished [10];
  int new_fd;
  int nextIndex;
  
  msgFlags[6] = true;
  msgFlags[7] = false;
  msgFlags[8] = false;
  msgFlags[9] = false;
  msgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&their_addr.__ss_align,10,(allocator_type *)&local_d8);
  _sin_size = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _sin_size = (pointer)operator_new(0x50);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = _sin_size + 10;
  _sin_size[8]._M_id._M_thread = 0;
  _sin_size[9]._M_id._M_thread = 0;
  _sin_size[6]._M_id._M_thread = 0;
  _sin_size[7]._M_id._M_thread = 0;
  _sin_size[4]._M_id._M_thread = 0;
  _sin_size[5]._M_id._M_thread = 0;
  _sin_size[2]._M_id._M_thread = 0;
  _sin_size[3]._M_id._M_thread = 0;
  (_sin_size->_M_id)._M_thread = 0;
  _sin_size[1]._M_id._M_thread = 0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish =
       threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_d8,0);
  new_fd = 0;
  do {
    if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                ((deque<int,std::allocator<int>> *)&local_d8,&new_fd);
    }
    else {
      *local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = new_fd;
      local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
           (_Elt_pointer)((long)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 4);
    }
    lVar6 = (long)new_fd;
    iVar2 = new_fd + 1;
    *(undefined1 *)
     ((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar6 + 6) = 0;
    *(undefined1 *)((long)&servinfo + lVar6 + 6) = 0;
    new_fd = iVar2;
  } while (lVar6 < 9);
  local_218.ai_addrlen = 0;
  local_218._20_4_ = 0;
  local_218.ai_addr = (sockaddr *)0x0;
  local_218.ai_canonname = (char *)0x0;
  local_218.ai_next = (addrinfo *)0x0;
  local_218.ai_socktype = 1;
  local_218.ai_protocol = 0;
  local_218.ai_flags = 1;
  local_218.ai_family = 0;
  iVar2 = getaddrinfo((char *)0x0,"3491",&local_218,&local_88);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"getaddrinfo: ",0xd);
    pcVar4 = gai_strerror(iVar2);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10d240);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_d8);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)&sin_size);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&their_addr.__ss_align);
    std::vector<cUser,_std::allocator<cUser>_>::~vector
              ((vector<cUser,_std::allocator<cUser>_> *)
               &msgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return 1;
  }
  iVar2 = 0;
  for (paVar1 = local_88; paVar1 != (addrinfo *)0x0; paVar1 = paVar1->ai_next) {
    iVar2 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
    pcVar4 = "server: socket";
    if (iVar2 != -1) {
      iVar3 = setsockopt(iVar2,1,2,msgFlags + 6,4);
      if (iVar3 == -1) goto LAB_00104bdb;
      iVar3 = bind(iVar2,paVar1->ai_addr,paVar1->ai_addrlen);
      if (iVar3 != -1) break;
      close(iVar2);
      pcVar4 = "server: bind";
    }
    perror(pcVar4);
  }
  freeaddrinfo(local_88);
  if (paVar1 == (addrinfo *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"server: failed to bind",0x16);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    exit(1);
  }
  iVar3 = listen(iVar2,5);
  if (iVar3 == -1) {
    main_cold_2();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"My chat room server. Version Two.",0x21);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  while( true ) {
    do {
      while (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
             local_d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        new_fd = 0;
        do {
          uVar7 = (ulong)new_fd;
          if (*(char *)((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar7 + 6) ==
              '\x01') {
            *(undefined1 *)
             ((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + uVar7 + 6) = 0;
            *(undefined1 *)((long)&servinfo + uVar7 + 6) = 0;
            if ((ulong)((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)_sin_size >> 3) <=
                uVar7) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
              goto LAB_00104bdb;
            }
            std::thread::join();
            if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_d8,&new_fd);
            }
            else {
              *local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = new_fd;
              local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   (_Elt_pointer)
                   ((long)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 4);
            }
          }
          iVar3 = new_fd;
          new_fd = new_fd + 1;
        } while (iVar3 < 9);
      }
      msgFlags[2] = true;
      msgFlags[3] = false;
      msgFlags[4] = false;
      msgFlags[5] = false;
      finished[2] = false;
      finished[3] = false;
      finished[4] = false;
      finished[5] = false;
      iVar3 = accept(iVar2,(sockaddr *)local_1b0,(socklen_t *)(msgFlags + 2));
      finished[2] = (bool)(char)iVar3;
      finished[3] = (bool)(char)((uint)iVar3 >> 8);
      finished[4] = (bool)(char)((uint)iVar3 >> 0x10);
      finished[5] = (bool)(char)((uint)iVar3 >> 0x18);
    } while (iVar3 == 0);
    if (iVar3 == -1) {
      perror("accept");
    }
    inet_ntop((uint)(ushort)local_1b0._0_2_,
              local_1b0 + (ulong)((ushort)local_1b0._0_2_ != 2) * 4 + 4,local_1e8,0x2e);
    finished._6_4_ = *local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((bool *)local_d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
        (bool *)((long)local_d8._M_impl.super__Deque_impl_data._M_start._M_last + -4)) {
      operator_delete(local_d8._M_impl.super__Deque_impl_data._M_start._M_first);
      local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_d8._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_d8._M_impl.super__Deque_impl_data._M_start._M_last =
           (_Elt_pointer)((long)local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200);
      local_d8._M_impl.super__Deque_impl_data._M_start._M_first =
           local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_d8._M_impl.super__Deque_impl_data._M_start._M_node =
           local_d8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)((long)local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 4);
    }
    local_f8._M_data =
         (bool (*) [10])
         ((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 6);
    local_f0._M_data = (bool (*) [10])((long)&servinfo + 6);
    local_e0._M_data =
         (vector<cUser,_std::allocator<cUser>_> *)
         &msgs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8._M_data =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&their_addr.__ss_align;
    std::thread::
    thread<void(&)(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&),int&,int&,std::reference_wrapper<bool[10]>,std::reference_wrapper<bool[10]>,std::reference_wrapper<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::reference_wrapper<std::vector<cUser,std::allocator<cUser>>>,void>
              ((thread *)&new_fd,threadFunc,(int *)(finished + 6),(int *)(finished + 2),&local_f8,
               &local_f0,&local_e8,&local_e0);
    uVar7 = (ulong)(int)finished._6_4_;
    if ((ulong)((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)_sin_size >> 3) <= uVar7) break;
    if (_sin_size[uVar7]._M_id._M_thread != 0) goto LAB_00104bfc;
    _sin_size[uVar7]._M_id._M_thread = CONCAT44(nextIndex,new_fd);
    new_fd = 0;
    do {
      if (*(char *)((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + (long)new_fd + 6U) ==
          '\x01') {
        if ((ulong)((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                          _M_impl.super__Vector_impl_data._M_start - (long)_sin_size >> 3) <=
            (ulong)(long)new_fd) goto LAB_00104be0;
        std::thread::join();
        iVar3 = new_fd;
        lVar6 = (long)new_fd;
        *(undefined1 *)
         ((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + lVar6 + 6) = 0;
        *(undefined1 *)((long)&servinfo + lVar6 + 6) = 0;
        if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                    ((deque<int,std::allocator<int>> *)&local_d8,&new_fd);
        }
        else {
          *local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = iVar3;
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               (_Elt_pointer)((long)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 4);
        }
      }
      iVar3 = new_fd;
      new_fd = new_fd + 1;
    } while (iVar3 < 9);
  }
LAB_00104bee:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00104bfc:
  std::terminate();
LAB_00104bdb:
  main_cold_1();
LAB_00104be0:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  goto LAB_00104bee;
}

Assistant:

int main(){


    //the thousand of varibles needed to run these sockets
    int sockfd, new_fd, numbytes;  // listen on sock_fd, new connection on new_fd
    struct addrinfo hints, *servinfo, *p;
    struct sockaddr_storage their_addr; // connector's address information
    socklen_t sin_size;
    struct sigaction sa;
    int yes=1;
    char s[INET6_ADDRSTRLEN];
    int rv;



    //session based varibles to pass all the info around
    vector<cUser> currUsers;
    bool finished[MAX_NUM_THREADS];
    bool msgFlags[MAX_NUM_THREADS];
    vector<string> msgs(MAX_NUM_THREADS);
    vector<thread> threads(MAX_NUM_THREADS);
    queue<int> ordering;


    //initialize message queue and thread quit flags
    for(int i=0; i<MAX_NUM_THREADS; i++){
        ordering.push(i);
        finished[i] = false;
        msgFlags[i] = false;
    }

    //zero out the address space of the strucutre for safty
    memset(&hints, 0, sizeof hints);

    // like client this allows for IPV4 and IPV6
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;

    //use same ip address as return address
    hints.ai_flags = AI_PASSIVE;

    //get the info to create the socket
    if ((rv = getaddrinfo(NULL, PORT, &hints, &servinfo)) != 0) {
        cerr << "getaddrinfo: " <<  gai_strerror(rv) << endl;
        return 1;
    }

    // loop through all the results and bind to the first we can
    for(p = servinfo; p != NULL; p = p->ai_next) {

        if ((sockfd = socket(p->ai_family, p->ai_socktype,
                p->ai_protocol)) == -1) {
            perror("server: socket");
            continue;
        }

        if (setsockopt(sockfd, SOL_SOCKET, SO_REUSEADDR, &yes,
                sizeof(int)) == -1) {
            perror("setsockopt");
            exit(1);
        }

        //bind to the socket address
        if (bind(sockfd, p->ai_addr, p->ai_addrlen) == -1) {
            close(sockfd);
            perror("server: bind");
            continue;
        }

        break;
    }


    freeaddrinfo(servinfo); // all done with this structure

    //check if something went wrong
    if (p == NULL)  {
        cerr << "server: failed to bind" << endl;
        exit(1);
    }

    //start listening on the socket
    if (listen(sockfd, BACKLOG) == -1) {
        perror("listen");
        exit(1);
    }

    //init message
    cout << "My chat room server. Version Two." << endl;




    while(1){

        //if at max clients what to accept until a connection was closed
        //stops people over max number of connections from connecting
        while(ordering.empty()){
            for(int i=0; i<MAX_NUM_THREADS; i++){
                if(finished[i]){
                    finished[i] = false;
                    msgFlags[i] = false;
                    threads.at(i).join();
                    ordering.push(i);
                }
            }
        }

        //get the accepted connection
        sin_size = sizeof their_addr;
        new_fd = 0;
        new_fd = accept(sockfd, (struct sockaddr *)&their_addr, &sin_size);

        //check for errors
        if (new_fd == -1) {
            perror("accept");
        }
        else if(new_fd == 0){
            //cout << "testing";
            continue;
        }

        //turn the address from binary to family friendly G rated words
        //I don't use this here but I will definily later, this is really cool :)
        inet_ntop(their_addr.ss_family,
            get_in_addr((struct sockaddr *)&their_addr),
            s, sizeof s);


        //cout << "server: got connection from " <<  s << endl;

        //get the next threadid to spawn
        int nextIndex = ordering.front();
        ordering.pop();

        //spawn a thread for the new connection made
        threads.at(nextIndex) = thread(threadFunc,nextIndex,new_fd,
            ref(finished),ref(msgFlags),ref(msgs),ref(currUsers));


        //check if any clients have quite, reap the thread and free the index
        // make sure to set the flags back and add the index back to the queue
        for(int i=0; i<MAX_NUM_THREADS; i++){
            if(finished[i]){
                threads.at(i).join();
                finished[i] = false;
                msgFlags[i] = false;
                ordering.push(i);
            }
        }


    }

    //tity up everyting
    close(sockfd);

    return 0;
}